

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::MinLayerParams::_InternalParse
          (MinLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  char *local_38;
  uint local_2c;
  
  local_38 = ptr;
  while( true ) {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_38);
    if (bVar1) {
      return local_38;
    }
    local_38 = google::protobuf::internal::ReadTag(local_38,&local_2c,0);
    tag_00 = local_2c;
    if ((local_2c == 0) || ((local_2c & 7) == 4)) break;
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    local_38 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_38,ctx);
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  if (local_38 == (char *)0x0) {
    return (char *)0x0;
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_2c - 1;
  return local_38;
}

Assistant:

const char* MinLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}